

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxInputComponentsTest::~GeometryShaderMaxInputComponentsTest
          (GeometryShaderMaxInputComponentsTest *this)

{
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxInputComponentsTest_01df82a0;
  std::__cxx11::string::~string((string *)&this->m_max_geometry_input_vectors_string);
  TestCaseBase::~TestCaseBase((TestCaseBase *)this);
  return;
}

Assistant:

virtual ~GeometryShaderMaxInputComponentsTest()
	{
	}